

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O2

uintptr_t __thiscall r_comp::Metadata::get_sys_classes_size(Metadata *this)

{
  long lVar1;
  __node_base *p_Var2;
  uintptr_t uVar3;
  
  p_Var2 = &(this->sys_classes)._M_h._M_before_begin;
  uVar3 = 1;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    lVar1 = r_code::GetStringSize((string *)(p_Var2 + 1));
    uVar3 = uVar3 + lVar1 + 1;
  }
  return uVar3;
}

Assistant:

uintptr_t Metadata::get_sys_classes_size()
{
    size_t size = 1; // size of the hash table

    for (const auto &elem : sys_classes) {
        size += r_code::GetStringSize(elem.first) + 1;    // +1: index to the class in the class array
    }

    return size;
}